

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn.c
# Opt level: O2

void bignum_mul(bn *a,bn *b,bn *c)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  bn tmp;
  bn row;
  bn local_130;
  bn local_b0;
  
  if (a == (bn *)0x0) {
    __assert_fail("a && \"a is null\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                  ,0xf7,"void bignum_mul(struct bn *, struct bn *, struct bn *)");
  }
  if (b != (bn *)0x0) {
    if (c != (bn *)0x0) {
      bignum_init(c);
      for (uVar1 = 0; uVar1 != 0x20; uVar1 = uVar1 + 1) {
        bignum_init(&local_b0);
        uVar2 = uVar1;
        for (lVar3 = 0; lVar3 != 0x80; lVar3 = lVar3 + 4) {
          if (uVar2 < 0x20) {
            bignum_init(&local_130);
            bignum_from_int(&local_130,
                            (ulong)*(uint *)((long)b->array + lVar3) * (ulong)a->array[uVar1]);
            _lshift_word(&local_130,(int)uVar2);
            bignum_add(&local_130,&local_b0,&local_b0);
          }
          uVar2 = uVar2 + 1;
        }
        bignum_add(c,&local_b0,c);
      }
      return;
    }
    __assert_fail("c && \"c is null\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                  ,0xf9,"void bignum_mul(struct bn *, struct bn *, struct bn *)");
  }
  __assert_fail("b && \"b is null\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                ,0xf8,"void bignum_mul(struct bn *, struct bn *, struct bn *)");
}

Assistant:

void bignum_mul(struct bn* a, struct bn* b, struct bn* c)
{
  require(a, "a is null");
  require(b, "b is null");
  require(c, "c is null");

  struct bn row;
  struct bn tmp;
  int i, j;

  bignum_init(c);

  for (i = 0; i < BN_ARRAY_SIZE; ++i)
  {
    bignum_init(&row);

    for (j = 0; j < BN_ARRAY_SIZE; ++j)
    {
      if (i + j < BN_ARRAY_SIZE)
      {
        bignum_init(&tmp);
        DTYPE_TMP intermediate = ((DTYPE_TMP)a->array[i] * (DTYPE_TMP)b->array[j]);
        bignum_from_int(&tmp, intermediate);
        _lshift_word(&tmp, i + j);
        bignum_add(&tmp, &row, &row);
      }
    }
    bignum_add(c, &row, c);
  }
}